

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O2

int __thiscall
FuzzingParameterSet::get_random_even_divisior(FuzzingParameterSet *this,int n,int min_value)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [8];
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  string local_a8;
  double local_88;
  FuzzingParameterSet *local_80;
  string local_78;
  undefined1 auStack_58 [8];
  vector<int,_std::allocator<int>_> divisors;
  allocator<char> local_31;
  
  divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(double)n;
  uVar4 = 1;
  local_88 = SQRT((double)divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  local_80 = this;
  while( true ) {
    uVar6 = SUB84(local_88,0);
    uVar7 = (undefined4)((ulong)local_88 >> 0x20);
    local_78._M_dataplus._M_p._0_4_ = uVar4;
    if ((double)divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < 0.0) {
      dVar2 = sqrt((double)divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      uVar6 = SUB84(dVar2,0);
      uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    if ((double)CONCAT44(uVar7,uVar6) < (double)(int)uVar4) break;
    uVar1 = (long)n / (long)(int)(uint)local_78._M_dataplus._M_p;
    if (n % (int)(uint)local_78._M_dataplus._M_p == 0) {
      if ((int)uVar1 == 1 && ((uint)local_78._M_dataplus._M_p & 1) == 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)auStack_58,(value_type_conflict2 *)&local_78
                  );
      }
      else {
        if (((uint)local_78._M_dataplus._M_p & 1) == 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)auStack_58,
                     (value_type_conflict2 *)&local_78);
          uVar1 = (long)n / (long)(int)(uint)local_78._M_dataplus._M_p;
        }
        if ((uVar1 & 1) == 0) {
          local_a8._M_dataplus._M_p._0_4_ = (int)uVar1;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)auStack_58,(int *)&local_a8);
        }
      }
    }
    uVar4 = (uint)local_78._M_dataplus._M_p + 1;
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)auStack_58,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,&local_80->gen);
  auVar3 = auStack_58;
  do {
    if (auVar3 == (undefined1  [8])
                  divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Could not determine a random even divisor of n=%d. Using n.",
                 &local_31);
      format_string<int>(&local_78,&local_a8,n);
      Logger::log_error(&local_78,true);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_a8);
      iVar5 = n;
      break;
    }
    iVar5 = *(int *)auVar3;
    auVar3 = (undefined1  [8])((long)auVar3 + 4);
  } while (iVar5 < min_value);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)auStack_58);
  return iVar5;
}

Assistant:

int FuzzingParameterSet::get_random_even_divisior(int n, int min_value) {
  std::vector<int> divisors;
  for (auto i = 1; i <= sqrt(n); i++) {
    if (n%i==0) {
      if ((n/i)==1 && (i%2)==0) {
        divisors.push_back(i);
      } else {
        if (i%2==0) divisors.push_back(i);
        if ((n/i)%2==0) divisors.push_back(n/i);
      }
    }
  }

  std::shuffle(divisors.begin(), divisors.end(), gen);
  for (const auto &e : divisors) {
    if (e >= min_value) return e;
  }

  Logger::log_error(format_string("Could not determine a random even divisor of n=%d. Using n.", n));
  return n;
}